

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O3

U32 __thiscall
HdlcSimulationDataGenerator::GenerateSimulationData
          (HdlcSimulationDataGenerator *this,U64 largest_sample_requested,U32 sample_rate,
          SimulationChannelDescriptor **simulation_channel)

{
  U8 UVar1;
  HdlcFrameType frameType;
  HdlcAddressType addressType;
  HdlcControlType controlType;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  size_type __n;
  HdlcSimulationDataGenerator *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> control;
  vector<unsigned_char,_std::allocator<unsigned_char>_> address;
  vector<unsigned_char,_std::allocator<unsigned_char>_> information;
  U8 local_82;
  allocator_type local_81;
  SimulationChannelDescriptor **local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  this_00 = (HdlcSimulationDataGenerator *)(ulong)sample_rate;
  local_80 = simulation_channel;
  uVar4 = AnalyzerHelpers::AdjustSimulationTargetSample
                    (largest_sample_requested,sample_rate,this->mSimulationSampleRateHz);
  uVar5 = SimulationChannelDescriptor::GetCurrentSampleNumber();
  if (uVar5 < uVar4) {
    do {
      CreateFlag(this);
      CreateFlag(this);
      frameType = this->mFrameTypes[this->mFrameNumber % 3];
      if (frameType == HDLC_S_FRAME) {
        __n = 0;
      }
      else {
        uVar2 = rand();
        uVar6 = uVar2 + 3;
        if (-1 < (int)uVar2) {
          uVar6 = uVar2;
        }
        __n = (size_type)((uVar2 - (uVar6 & 0xfffc)) + 1 & 0xffff);
      }
      iVar3 = rand();
      addressType = this->mSettings->mHdlcAddr;
      UVar1 = this->mAddresByteValue;
      this->mAddresByteValue = UVar1 + '\x01';
      GenAddressField(&local_60,this_00,addressType,(long)(iVar3 % 4 + 1),UVar1);
      controlType = this->mSettings->mHdlcControl;
      UVar1 = this->mControlValue;
      this->mControlValue = UVar1 + '\x01';
      GenControlField(&local_78,this_00,frameType,controlType,UVar1);
      local_82 = this->mInformationByteValue;
      this->mInformationByteValue = local_82 + '\x01';
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_48,__n,&local_82,&local_81);
      this_00 = (HdlcSimulationDataGenerator *)&local_60;
      CreateHDLCFrame(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,
                      &local_78,&local_48);
      CreateFlag(this);
      CreateFlag(this);
      this->mFrameNumber = this->mFrameNumber + 1;
      if ((pointer)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if ((HdlcAnalyzerSettings *)
          local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (HdlcAnalyzerSettings *)0x0) {
        operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      uVar5 = SimulationChannelDescriptor::GetCurrentSampleNumber();
    } while (uVar5 < uVar4);
  }
  *local_80 = &this->mHdlcSimulationData;
  return 1;
}

Assistant:

U32 HdlcSimulationDataGenerator::GenerateSimulationData( U64 largest_sample_requested, U32 sample_rate,
                                                         SimulationChannelDescriptor** simulation_channel )
{
    U64 adjusted_largest_sample_requested =
        AnalyzerHelpers::AdjustSimulationTargetSample( largest_sample_requested, sample_rate, mSimulationSampleRateHz );

    while( mHdlcSimulationData.GetCurrentSampleNumber() < adjusted_largest_sample_requested )
    {
        // Two consecutive flags
        CreateFlag();
        CreateFlag();

        HdlcFrameType frameType = mFrameTypes[ mFrameNumber % 3 ];
        U32 sizeOfInformation = ( frameType == HDLC_S_FRAME ) ? 0 : ( ( rand() % 4 ) + 1 );
        U64 addressBytes = ( ( rand() % 4 ) + 1 );

        vector<U8> address = GenAddressField( mSettings->mHdlcAddr, addressBytes, mAddresByteValue++ );
        vector<U8> control = GenControlField( frameType, mSettings->mHdlcControl, mControlValue++ );
        vector<U8> information = GenInformationField( sizeOfInformation, mInformationByteValue++ );

        CreateHDLCFrame( address, control, information );

        // Two consecutive flags
        CreateFlag();
        CreateFlag();

        mFrameNumber++;
    }

    *simulation_channel = &mHdlcSimulationData;
    return 1;
}